

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapDrive.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_5c268::MapDrivePlugIn::drawPathFencesOnMap
          (MapDrivePlugIn *this,TerrainMap *map,GCRoute *path)

{
  pointer ppMVar1;
  ulong uVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  Vec3 g;
  Vec3 local_64;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined1 local_48 [24];
  
  iVar4 = *(int *)((long)&(this->vehicles).
                          super__Vector_base<(anonymous_namespace)::MapDriver_*,_std::allocator<(anonymous_namespace)::MapDriver_*>_>
                          ._M_impl.super__Vector_impl_data._M_start + 4);
  fVar9 = (float)iVar4;
  uVar2 = *(ulong *)((long)&this->vehicle + 4);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar2;
  auVar11._4_4_ = fVar9;
  auVar11._0_4_ = fVar9;
  auVar11._8_4_ = fVar9;
  auVar11._12_4_ = fVar9;
  auVar11 = divps(auVar10,auVar11);
  fVar9 = auVar11._4_4_;
  local_64.x = ((float)uVar2 - auVar11._0_4_) * -0.5;
  local_64.z = ((float)(uVar2 >> 0x20) - fVar9) * -0.5;
  local_64.y = 0.0;
  if (0 < iVar4) {
    local_58 = CONCAT44(fVar9,(float)uVar2);
    uStack_50 = 0;
    local_48._4_4_ = 0;
    local_48._0_4_ = auVar11._0_4_;
    local_48._8_4_ = fVar9;
    local_48._12_4_ = 0;
    iVar7 = 0;
    do {
      if (0 < iVar4) {
        iVar8 = 0;
        do {
          fVar9 = mapPointToOutside((PolylineSegmentedPathwaySegmentRadii *)map,&local_64);
          iVar4 = *(int *)((long)&(this->vehicles).
                                  super__Vector_base<(anonymous_namespace)::MapDriver_*,_std::allocator<(anonymous_namespace)::MapDriver_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 4);
          if ((0.0 < fVar9) && (fVar9 < 1.0)) {
            iVar5 = iVar8 + iVar7 * iVar4;
            iVar6 = iVar7 * iVar4 + iVar8 + 0x3f;
            if (-1 < iVar5) {
              iVar6 = iVar5;
            }
            ppMVar1 = (this->vehicles).
                      super__Vector_base<(anonymous_namespace)::MapDriver_*,_std::allocator<(anonymous_namespace)::MapDriver_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage +
                      (long)(iVar6 >> 6) +
                      ((ulong)(((long)iVar5 & 0x800000000000003fU) < 0x8000000000000001) - 1);
            *ppMVar1 = (MapDriver *)((ulong)*ppMVar1 | 1L << ((byte)iVar5 & 0x3f));
          }
          if (1.0 < fVar9) {
            iVar5 = iVar8 + iVar7 * iVar4;
            iVar6 = iVar7 * iVar4 + iVar8 + 0x3f;
            if (-1 < iVar5) {
              iVar6 = iVar5;
            }
            bVar3 = (byte)iVar5 & 0x3f;
            ppMVar1 = (this->vehicles).
                      super__Vector_base<(anonymous_namespace)::MapDriver_*,_std::allocator<(anonymous_namespace)::MapDriver_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage +
                      (long)(iVar6 >> 6) +
                      ((ulong)(((long)iVar5 & 0x800000000000003fU) < 0x8000000000000001) - 1);
            *ppMVar1 = (MapDriver *)
                       ((ulong)*ppMVar1 & (-2L << bVar3 | 0xfffffffffffffffeU >> 0x40 - bVar3));
          }
          local_64.y = local_64.y + 0.0;
          local_64.x = local_64.x + (float)local_48._0_4_;
          local_64.z = local_64.z + (float)local_48._4_4_;
          iVar8 = iVar8 + 1;
        } while (iVar8 < iVar4);
      }
      local_64.z = local_64.z + local_58._4_4_;
      local_64.x = local_64.x - (float)local_58;
      iVar7 = iVar7 + 1;
    } while (iVar7 < iVar4);
  }
  return;
}

Assistant:

void drawPathFencesOnMap (TerrainMap& map, GCRoute& path)
        {
    #ifdef OLDTERRAINMAP
            const float xs = map.xSize / (float)map.resolution;
            const float zs = map.zSize / (float)map.resolution;
            const Vec3 alongRow (xs, 0, 0);
            const Vec3 nextRow (-map.xSize, 0, zs);
            Vec3 g ((map.xSize - xs) / -2, 0, (map.zSize - zs) / -2);
            for (int j = 0; j < map.resolution; j++)
            {
                for (int i = 0; i < map.resolution; i++)
                {
                    const float outside = mapPointToOutside( path, g ); // path.howFarOutsidePath (g);
                    const float wallThickness = 1.0f;

                    // set map cells adjacent to the outside edge of the path
                    if ((outside > 0) && (outside < wallThickness))
                        map.setMapBit (i, j, true);

                    // clear all other off-path map cells 
                    if (outside > wallThickness) map.setMapBit (i, j, false);

                    g += alongRow;
                }
                g += nextRow;
            }
    #else
    #endif
        }